

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O0

void save_textures(vector<Image,_std::allocator<Image>_> *out_buf,int starting_index)

{
  Image image_00;
  bool bVar1;
  ostream *poVar2;
  reference pIVar3;
  char *fileName;
  Image image;
  string local_90;
  string local_70;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_50;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_48;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> local_40;
  __normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_> it;
  string filename;
  uint log_index;
  int starting_index_local;
  vector<Image,_std::allocator<Image>_> *out_buf_local;
  
  if (!preview_mode) {
    poVar2 = std::operator<<((ostream *)&std::cout,"saving images:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)&it);
    local_48._M_current = (Image *)std::vector<Image,_std::allocator<Image>_>::begin(out_buf);
    local_40 = __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
               operator+(&local_48,(long)starting_index);
    filename.field_2._8_4_ = starting_index;
    while( true ) {
      local_50._M_current = (Image *)std::vector<Image,_std::allocator<Image>_>::end(out_buf);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      std::__cxx11::string::string((string *)&local_90,(string *)&output_dir_abi_cxx11_);
      std::__cxx11::string::string((string *)&image.mipmaps,(string *)&out_filetype_abi_cxx11_);
      get_file_name(&local_70,&local_90,filename.field_2._8_4_,(string *)&image.mipmaps);
      std::__cxx11::string::operator=((string *)&it,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&image.mipmaps);
      std::__cxx11::string::~string((string *)&local_90);
      poVar2 = std::operator<<((ostream *)&std::cout,"\tsaving image to filename ");
      poVar2 = std::operator<<(poVar2,(string *)&it);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pIVar3 = __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
               operator*(&local_40);
      image.width = pIVar3->mipmaps;
      image.height = pIVar3->format;
      image.data = *(void **)&pIVar3->width;
      image_00 = *pIVar3;
      fileName = (char *)std::__cxx11::string::c_str();
      ExportImage(image_00,fileName);
      filename.field_2._8_4_ = filename.field_2._8_4_ + 1;
      __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::operator++
                (&local_40);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&it);
  }
  return;
}

Assistant:

void save_textures(std::vector<Image> out_buf, int starting_index)
{
	if (!preview_mode) {
	std::cout << "saving images:" << std::endl;

	unsigned int log_index = starting_index;
	std::string filename;
	for (auto it = out_buf.begin()+starting_index; it != out_buf.end(); ++it) {
		filename = get_file_name(output_dir, log_index, out_filetype);
		std::cout << "\tsaving image to filename " << filename << std::endl;

		Image image = *it;
		ExportImage(image, filename.c_str());
		++log_index;
	}
	std::cout << std::endl;
	}
}